

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

Abc_Cex_t * Bmcs_ManGenerateCex(Bmcs_Man_t *p,int i,int f,int s)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Cex_t *pAVar5;
  Gia_Obj_t *pObj;
  int iVar6;
  int iVar7;
  
  pGVar1 = p->pGia;
  iVar6 = pGVar1->nRegs;
  iVar7 = pGVar1->vCos->nSize - iVar6;
  pAVar5 = Abc_CexMakeTriv(iVar6,pGVar1->vCis->nSize - iVar6,iVar7,f * iVar7 + i);
  iVar6 = 0;
  iVar7 = 1;
  while( true ) {
    pGVar1 = p->pFrames;
    if (pGVar1->vCis->nSize - pGVar1->nRegs <= iVar6) {
      return pAVar5;
    }
    iVar2 = Vec_IntEntry(pGVar1->vCis,iVar6);
    pObj = Gia_ManObj(pGVar1,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p->pFrames,pObj);
    iVar2 = Vec_IntEntry(&p->vFr2Sat,iVar2);
    if ((0 < iVar2) && (iVar2 = satoko_read_cex_varvalue(p->pSats[s],iVar2), iVar2 != 0)) {
      iVar3 = Vec_IntEntry(&p->vCiMap,iVar7 + -1);
      iVar4 = Vec_IntEntry(&p->vCiMap,iVar7);
      iVar2 = p->pGia->nRegs;
      iVar2 = iVar3 + iVar2 + (p->pGia->vCis->nSize - iVar2) * iVar4;
      (&pAVar5[1].iPo)[iVar2 >> 5] = (&pAVar5[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
    }
    iVar6 = iVar6 + 1;
    iVar7 = iVar7 + 2;
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Bmcs_ManGenerateCex( Bmcs_Man_t * p, int i, int f, int s )
{
    Abc_Cex_t * pCex = Abc_CexMakeTriv( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), Gia_ManPoNum(p->pGia), f*Gia_ManPoNum(p->pGia)+i );
    Gia_Obj_t * pObj;  int k;
    Gia_ManForEachPi( p->pFrames, pObj, k )
    {
        int iSatVar = Vec_IntEntry( &p->vFr2Sat, Gia_ObjId(p->pFrames, pObj) );
        if ( iSatVar > 0 && bmc_sat_solver_read_cex_varvalue(p->pSats[s], iSatVar) ) // 1 bit
        {
            int iCiId   = Vec_IntEntry( &p->vCiMap, 2*k+0 );
            int iFrame  = Vec_IntEntry( &p->vCiMap, 2*k+1 );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pGia) + iFrame * Gia_ManPiNum(p->pGia) + iCiId );
        }
    }
    return pCex;
}